

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::scan
               (NameMapper *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_> *pPVar6;
  _func_void_NameMapper_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBlock,
               currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_001104ea:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitIf,
               currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_001108cf;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                     ).
                     super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                     .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00110331;
  case LoopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitLoop,
               currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_001108cf;
    }
    goto LAB_0010fda6;
  case BreakId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBreak,
               currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_001108cf;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                     ).
                     super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                     .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0010fbee;
  case SwitchId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitSwitch,
               currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x0010fbe8;
  case CallId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitCall,
               currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_001108cf;
    }
    break;
  case LocalSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_001108cf;
    }
    goto LAB_001100dd;
  case GlobalGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_001108cf;
    }
    break;
  case GlobalSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_001108cf;
    }
    goto LAB_0010fda6;
  case LoadId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitLoad,
               currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_00110331;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_001108cf;
  case StoreId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitStore,
               currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_001108cf;
    }
    goto LAB_001100a2;
  case ConstId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitConst,
               currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_001108cf;
    }
    break;
  case UnaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitUnary,
               currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_001108cf;
    }
    goto LAB_001100dd;
  case BinaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBinary,
               currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_001108cf;
    }
    goto LAB_00110031;
  case SelectId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitSelect,
               currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_001108cf;
    }
    goto LAB_0011030d;
  case DropId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitDrop,
               currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case ReturnId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitReturn,
               currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_001108cf;
    }
    goto LAB_0010fbdf;
  case MemorySizeId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_001108cf;
    }
    break;
  case MemoryGrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case NopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitNop,
               currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_001108cf;
    }
    break;
  case UnreachableId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_001108cf;
    }
    break;
  case AtomicRMWId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_001108cf;
    }
    goto LAB_00110126;
  case AtomicCmpxchgId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_001108cf;
    }
    goto LAB_00110117;
  case AtomicWaitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_001108cf;
    }
    goto LAB_0010fdcb;
  case AtomicNotifyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_001108cf;
    }
    goto LAB_00110031;
  case AtomicFenceId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_001108cf;
    }
    break;
  case SIMDExtractId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_001108cf;
    }
    goto LAB_001100dd;
  case SIMDReplaceId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_001108cf;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_0011003c;
  case SIMDShuffleId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_001108cf;
    }
    goto LAB_0011031c;
  case SIMDTernaryId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_001108cf;
    }
    goto LAB_0010fdcb;
  case SIMDShiftId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_001108cf;
    }
    goto LAB_00110031;
  case SIMDLoadId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_001108cf;
    }
    goto LAB_0010ffaa;
  case SIMDLoadStoreLaneId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_001108cf;
    }
LAB_001100a2:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00110331;
  case MemoryInitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_001108cf;
    }
    goto LAB_00110117;
  case DataDropId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_001108cf;
    }
    break;
  case MemoryCopyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_001108cf;
    }
    goto LAB_0011030d;
  case MemoryFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_001108cf;
    }
    goto LAB_0011030d;
  case PopId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitPop,
               currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_001108cf;
    }
    break;
  case RefNullId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefNull
               ,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_001108cf;
    }
    break;
  case RefIsNullId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case RefFuncId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefFunc
               ,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_001108cf;
    }
    break;
  case RefEqId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefEq,
               currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_001108cf;
    }
    goto LAB_0011031c;
  case TableGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_001108cf;
    }
    goto LAB_0010fda6;
  case TableSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_001108cf;
    }
    goto LAB_00110126;
  case TableSizeId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_001108cf;
    }
    break;
  case TableGrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_001108cf;
    }
    goto LAB_00110126;
  case TableFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_001108cf;
    }
    goto LAB_00110117;
  case TableCopyId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_001108cf;
    }
    goto LAB_0011030d;
  case TableInitId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_001108cf;
    }
    goto LAB_00110117;
  case TryId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitTry,
               currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_001108cf;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_0010fda6:
    pEVar1 = pEVar1 + 2;
    goto LAB_00110331;
  case TryTableId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case ThrowId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitThrow,
               currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRethrow
               ,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_001108cf;
    }
    break;
  case ThrowRefId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case TupleMakeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case RefI31Id:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefI31,
               currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case I31GetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitI31Get,
               currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case CallRefId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitCallRef
               ,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefTest
               ,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case RefCastId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefCast
               ,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case BrOnId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitBrOn,
               currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_001108cf;
    }
LAB_0010ffaa:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00110331;
  case StructNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_001108cf;
    }
    goto LAB_001100dd;
  case StructSetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_001108cf;
    }
    goto LAB_00110031;
  case StructRMWId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_001108cf;
    }
    goto LAB_00110031;
  case StructCmpxchgId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_001108cf;
    }
LAB_0010fdcb:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_0011003c;
  case ArrayNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
LAB_0010fbdf:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x0010fbe8:
    if (lVar5 != 0) {
LAB_0010fbee:
      local_40 = scan;
      SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                     ).
                     super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                     .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                     stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_001108cf;
    }
    goto LAB_00110126;
  case ArrayNewElemId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_001108cf;
    }
    goto LAB_00110126;
  case ArrayNewFixedId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_001108cf;
    }
    goto LAB_0011031c;
  case ArraySetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_001108cf;
    }
    goto LAB_0011030d;
  case ArrayLenId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_001108cf;
    }
    goto LAB_0010fe72;
  case ArrayCopyId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    goto LAB_001102fe;
  case ArrayFillId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_001108cf;
    }
LAB_001102fe:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_0011030d;
  case ArrayInitDataId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_001108cf;
    }
    goto LAB_0010f669;
  case ArrayInitElemId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_001108cf;
    }
LAB_0010f669:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_00110117:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
LAB_00110126:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00110331;
  case RefAsId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitRefAs,
               currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_001108cf;
    }
    goto LAB_001100dd;
  case StringNewId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                       ).
                       super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                       .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                       ).
                       super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                       .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00110331;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_001108cf;
  case StringConstId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_001108cf;
    }
    break;
  case StringMeasureId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_001108cf;
    }
LAB_001100dd:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00110331;
  case StringEncodeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
        ::
        emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                       ).
                       super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                       .super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                (&pPVar6->
                  super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00110331;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_001108cf:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case StringConcatId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_001108cf;
    }
    goto LAB_0011031c;
  case StringEqId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_001108cf;
    }
LAB_00110031:
    currp_00 = pEVar1 + 2;
LAB_0011003c:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00110331;
  case StringWTF16GetId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_001108cf;
    }
    goto LAB_0011031c;
  case StringSliceWTFId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_001108cf;
    }
LAB_0011030d:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
LAB_0011031c:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00110331;
  case ContNewId:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitContNew
               ,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_001108cf;
    }
LAB_0010fe72:
    pEVar1 = pEVar1 + 1;
LAB_00110331:
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
                super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case ContBindId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case SuspendId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitSuspend
               ,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_001108cf;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::doVisitResume,
               currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[5].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 5) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeThrowId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[6].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 6) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StackSwitchId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
              ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>;
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::
               doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_001108cf;
    }
    Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
              (&pPVar6->super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,
               scan,(Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_001104ea;
        Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::pushTask
                  (&pPVar6->
                    super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>,scan
                   ,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }